

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_align.h
# Opt level: O2

void clear_aligned(void *ptr,size_t size)

{
  void *pvVar1;
  ulong __len;
  
  __len = size + 0x3f & 0xffffffffffffffc0;
  pvVar1 = mmap(ptr,__len,3,0x32,-1,0);
  if (pvVar1 != (void *)0xffffffffffffffff) {
    return;
  }
  memset(ptr,0,__len);
  return;
}

Assistant:

static inline void
clear_aligned(void* ptr, size_t size)
{
    // make sure size is a multiple of LINE_SIZE
    size = (size + LINE_SIZE - 1) & (~(LINE_SIZE - 1));
#if SYLVAN_USE_MMAP
    // this is a trick to use mmap to try and reassign fresh zero'ed pages to the region
    void* res = mmap(ptr, size, PROT_READ | PROT_WRITE, MAP_PRIVATE | MAP_ANONYMOUS | MAP_FIXED, -1, 0);
    if (res == MAP_FAILED) memset(ptr, 0, size);
#else
    memset(ptr, 0, size);
#endif
}